

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall Logger::logBreak(Logger *this)

{
  ostream *this_00;
  Logger *this_local;
  
  std::__cxx11::string::clear();
  std::__cxx11::string::resize((ulong)&this->mLastLog);
  std::__cxx11::string::assign((ulong)&this->mLastLog,-3);
  this_00 = std::operator<<((ostream *)this,(string *)&this->mLastLog);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Logger::logBreak() {
    mLastLog.clear();
    mLastLog.resize(256);
    mLastLog.assign(253, '-');
    mLogStream << mLastLog << std::endl;
}